

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON_writer.hh
# Opt level: O0

Writer * __thiscall JSON::Writer::writeEnd(Writer *this,char *c)

{
  size_t in_RCX;
  char *c_local;
  Writer *this_local;
  
  if (1 < this->indent) {
    in_RCX = this->indent - 2;
    this->indent = in_RCX;
  }
  if ((this->first & 1U) == 0) {
    this->first = true;
    writeNext(this);
  }
  this->first = false;
  write(this,(int)c,(void *)0x1,in_RCX);
  return this;
}

Assistant:

Writer&
    writeEnd(char const& c)
    {
        if (indent > 1) {
            indent -= 2;
        }
        if (!first) {
            first = true;
            writeNext();
        }
        first = false;
        write(&c, 1);
        return *this;
    }